

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O2

RenderableBatch * __thiscall nite::Batch::draw(Batch *this,float x,float y,float angle)

{
  float fVar1;
  float fVar2;
  RenderableBatch *this_00;
  float fVar3;
  Vec2 local_48;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  
  if (this->objectId < 0) {
    return (RenderableBatch *)0x0;
  }
  local_30 = (this->size).x;
  fVar1 = (this->region).w;
  if ((fVar1 != local_30) || (NAN(fVar1) || NAN(local_30))) {
    fVar3 = (this->region).h;
  }
  else {
    local_2c = (this->size).y;
    fVar3 = (this->region).h;
    if ((fVar3 == local_2c) && (!NAN(fVar3) && !NAN(local_2c))) goto LAB_00189e70;
  }
  local_2c = fVar3;
  local_30 = fVar1;
LAB_00189e70:
  local_3c = angle;
  local_38 = y;
  local_34 = x;
  this_00 = (RenderableBatch *)operator_new(0x90);
  memset(this_00,0,0x90);
  RenderableBatch::RenderableBatch(this_00);
  this_00->objectId = this->objectId;
  this_00->origSize = this->size;
  (this_00->size).x = local_30;
  (this_00->size).y = local_2c;
  this_00->orig = this;
  (this_00->super_Renderable).position.x = local_34;
  (this_00->super_Renderable).position.y = local_38;
  this_00->angle = local_3c;
  this_00->smooth = this->smooth;
  Vec2::Vec2(&local_48,0.0,0.0);
  this_00->origin = local_48;
  (this_00->super_Renderable).function = drawBatch;
  (this_00->super_Renderable).color = currentColor;
  fVar1 = (this->region).y;
  fVar3 = (this->region).w;
  fVar2 = (this->region).h;
  (this_00->region).x = (this->region).x;
  (this_00->region).y = fVar1;
  (this_00->region).w = fVar3;
  (this_00->region).h = fVar2;
  this_00->scale = this->scale;
  addRenderList((Renderable *)this_00);
  return this_00;
}

Assistant:

RenderableBatch *nite::Batch::draw(float x, float y, float angle){
	if(objectId <= -1) return NULL;
	float rw = size.x;
	float rh = size.y;
	if(region.w != size.x || region.h != size.y){
		rw = region.w;
		rh = region.h;
	}
	nite::RenderableBatch *obj = new nite::RenderableBatch();
	obj->objectId = objectId;
	obj->origSize = size;
	obj->size.x = rw;
	obj->size.y	= rh;
	obj->orig = this;
	obj->position.x = x;
	obj->position.y = y;
	obj->angle = angle;
	obj->smooth = smooth;
	obj->origin = nite::Vec2(0, 0);
	obj->function = &drawBatch;
	obj->color = nite::getColor();
	obj->region	= region;
	obj->scale = scale;
	nite::addRenderList((nite::Renderable*)obj);
	return obj;
}